

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_reference_unittest.cpp
# Opt level: O3

void __thiscall
ArrayReference_from_std_vector_Test::TestBody(ArrayReference_from_std_vector_Test *this)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  undefined8 *__ptr;
  char *message;
  initializer_list<int> __l;
  void *ptr;
  stdvec svec;
  uint local_74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 *local_68;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_60;
  undefined4 local_58;
  AssertHelper local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  local_68 = (undefined8 *)0x600000005;
  sStack_60.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x800000007;
  local_58 = 9;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_68;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l,(allocator_type *)&local_70);
  iVar5 = posix_memalign(&local_68,8,0x28);
  __ptr = local_68;
  if (iVar5 != 0) {
    __ptr = (undefined8 *)0x0;
  }
  __ptr[2] = 0;
  __ptr[3] = 0;
  *__ptr = 0;
  __ptr[1] = 0;
  __ptr[4] = 0;
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0x14) {
    __assert_fail("other.size()==size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                  ,0x2e7,
                  "ArrayReference<T, Coord> &memory::ArrayReference<int, memory::HostCoordinator<int>>::operator=(const std::vector<value_type, Allocator> &) [T = int, Coord = memory::HostCoordinator<int>, Allocator = std::allocator<int>]"
                 );
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar2 = *(undefined8 *)
             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar3 = *(undefined8 *)
             (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start + 2);
    *(int *)((long)__ptr + 0x24) =
         local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start[4];
    *(undefined8 *)((long)__ptr + 0x14) = uVar2;
    *(undefined8 *)((long)__ptr + 0x1c) = uVar3;
  }
  local_74 = 5;
  do {
    if (9 < local_74) {
      __assert_fail("i<size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/include/ArrayView.hpp"
                    ,0x186,
                    "reference memory::ArrayViewImpl<memory::ArrayReference<int, memory::HostCoordinator<int>>, int, memory::HostCoordinator<int>>::operator[](size_type) [R = memory::ArrayReference<int, memory::HostCoordinator<int>>, T = int, Coord = memory::HostCoordinator<int>]"
                   );
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_68,"v1[i]","i",(int *)((long)__ptr + (ulong)local_74 * 4),
               (int *)&local_74);
    if (local_68._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_70);
      message = "";
      if (sStack_60.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        message = ((sStack_60.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/bcumming[P]vector/tests/array_reference_unittest.cpp"
                 ,0x3b,message);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (((local_70.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         (local_70.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_70.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_60,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar1 = local_74 + 1;
    bVar4 = (int)local_74 < 9;
    local_74 = uVar1;
  } while (bVar4);
  if (__ptr != (undefined8 *)0x0) {
    free(__ptr);
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(ArrayReference, from_std_vector) {
    using namespace memory;

    using by_value = Array<int, HostCoordinator<int>>;

    using stdvec = std::vector<int>;

    stdvec svec = {5,6,7,8,9};

    // create range by value of length 10
    by_value v1(10, 0);

    v1(5, 10) = svec;

    for(auto i=5; i<10; ++i)
        EXPECT_EQ(v1[i], i);
}